

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

shared_ptr<vmips::MemoryLocation> __thiscall vmips::Function::new_memory(Function *this,size_t size)

{
  size_t sVar1;
  element_type *peVar2;
  size_t in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<vmips::MemoryLocation> sVar3;
  shared_ptr<vmips::VirtReg> local_38;
  undefined1 local_21;
  size_t local_20;
  size_t size_local;
  Function *this_local;
  shared_ptr<vmips::MemoryLocation> *res;
  
  local_21 = 0;
  local_20 = in_RDX;
  size_local = size;
  this_local = this;
  std::make_shared<vmips::MemoryLocation>();
  peVar2 = std::__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar2->size = local_20;
  sVar1 = *(size_t *)(size + 0x28);
  *(size_t *)(size + 0x28) = sVar1 + 1;
  peVar2 = std::__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar2->identifier = sVar1;
  peVar2 = std::__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar2->status = Undetermined;
  peVar2 = std::__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  peVar2->offset = 0xffffffffffffffff;
  get_special((vmips *)&local_38,s8);
  peVar2 = std::__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<vmips::VirtReg>::operator=(&peVar2->base,&local_38);
  std::shared_ptr<vmips::VirtReg>::~shared_ptr(&local_38);
  std::
  vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ::push_back((vector<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
               *)(size + 0xf0),(value_type *)this);
  sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<vmips::MemoryLocation>)
         sVar3.super___shared_ptr<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<MemoryLocation> Function::new_memory(size_t size) {
    auto res = std::make_shared<MemoryLocation>();
    res->size = size;
    res->identifier = memory_count++;
    res->status = MemoryLocation::Undetermined;
    res->offset = -1;
    res->base = get_special(SpecialReg::s8);
    mem_blocks.push_back(res);
    return res;
}